

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleMallocTrace.cpp
# Opt level: O3

void childafterfork(void)

{
  pointer *pppSVar1;
  iterator __position;
  vector<SMTMap_*,_std::allocator<SMTMap_*>_> *pvVar2;
  int iVar3;
  SMTMap *this;
  long in_FS_OFFSET;
  SMTMap *globalmap;
  SMTMap *local_18;
  
  puts("In a forked child, let\'s clean mmap and mutex");
  pthread_mutex_unlock((pthread_mutex_t *)&maplock);
  pthread_mutex_destroy((pthread_mutex_t *)&maplock);
  iVar3 = pthread_mutex_init((pthread_mutex_t *)&maplock,(pthread_mutexattr_t *)0x0);
  if (iVar3 == 0) {
    *(undefined4 *)(in_FS_OFFSET + -8) = 1;
    smtmaplist = (vector<SMTMap_*,_std::allocator<SMTMap_*>_> *)operator_new(0x18);
    (smtmaplist->super__Vector_base<SMTMap_*,_std::allocator<SMTMap_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (smtmaplist->super__Vector_base<SMTMap_*,_std::allocator<SMTMap_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (smtmaplist->super__Vector_base<SMTMap_*,_std::allocator<SMTMap_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this = (SMTMap *)operator_new(0x440);
    SMTMap::SMTMap(this,"before main()","main()",0);
    builtin_strncpy(this->stopfile,"after main()",0xd);
    builtin_strncpy(this->stopfunction,"main()",7);
    this->stopline = 0;
    pvVar2 = smtmaplist;
    __position._M_current =
         (smtmaplist->super__Vector_base<SMTMap_*,_std::allocator<SMTMap_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    local_18 = this;
    if (__position._M_current ==
        (smtmaplist->super__Vector_base<SMTMap_*,_std::allocator<SMTMap_*>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<SMTMap*,std::allocator<SMTMap*>>::_M_realloc_insert<SMTMap*const&>
                ((vector<SMTMap*,std::allocator<SMTMap*>> *)smtmaplist,__position,&local_18);
    }
    else {
      *__position._M_current = this;
      pppSVar1 = &(pvVar2->super__Vector_base<SMTMap_*,_std::allocator<SMTMap_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
    *(undefined4 *)(in_FS_OFFSET + -8) = 0;
    puts("child process after fork callback done");
    return;
  }
  puts("fail to init mutex");
  exit(1);
}

Assistant:

static void childafterfork()
{
    SMTLOG("In a forked child, let's clean mmap and mutex\n");
    pthread_mutex_unlock(&maplock);
    pthread_mutex_destroy(&maplock);
    if (pthread_mutex_init(&maplock, 0)) {
        SMTLOG("fail to init mutex\n");
        exit(1);
    }
    use_origin_malloc = 1;
    smtmaplist = new std::vector<SMTMap*>();
    if (!smtmaplist) {
        SMTLOG("fail to new mmap\n");
        exit(1);
    }
    SMTMap* globalmap = new SMTMap("before main()", "main()", 0);
    if (globalmap) {
        globalmap->stopAt("after main()", "main()", 0);
        smtmaplist->push_back(globalmap);
    }
    use_origin_malloc = 0;
	SMTLOG("child process after fork callback done\n");
}